

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O0

void __thiscall ncnn::PoolAllocator::clear(PoolAllocator *this)

{
  bool bVar1;
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_> *in_RDI
  ;
  void *ptr;
  iterator it;
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  *in_stack_ffffffffffffffc8;
  _Self local_18;
  _Self local_10 [2];
  
  Mutex::lock((Mutex *)0x11638c);
  local_10[0]._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
       begin(in_stack_ffffffffffffffc8);
  while( true ) {
    local_18._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
         ::end(in_stack_ffffffffffffffc8);
    bVar1 = std::operator!=(local_10,&local_18);
    if (!bVar1) break;
    std::_List_iterator<std::pair<unsigned_long,_void_*>_>::operator->
              ((_List_iterator<std::pair<unsigned_long,_void_*>_> *)0x1163d1);
    ncnn::fastFree((void *)0x1163e4);
    std::_List_iterator<std::pair<unsigned_long,_void_*>_>::operator++(local_10,0);
  }
  std::__cxx11::
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::clear
            (in_RDI);
  Mutex::unlock((Mutex *)0x116413);
  return;
}

Assistant:

void PoolAllocator::clear()
{
    budgets_lock.lock();

    std::list< std::pair<size_t, void*> >::iterator it = budgets.begin();
    for (; it != budgets.end(); it++)
    {
        void* ptr = it->second;
        ncnn::fastFree(ptr);
    }
    budgets.clear();

    budgets_lock.unlock();
}